

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
          (cmInstallDirectoryGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,char *dest,char *file_permissions,char *dir_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all,
          char *literal_args,bool optional)

{
  pointer pbVar1;
  size_type sVar2;
  pointer input;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message,exclude_from_all)
  ;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallDirectoryGenerator_006326d0;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,dirs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->FilePermissions,file_permissions,&local_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->DirPermissions,dir_permissions,&local_2a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->LiteralArguments,literal_args,&local_2b);
  this->Optional = optional;
  sVar2 = cmGeneratorExpression::Find(&(this->super_cmInstallGenerator).Destination);
  if (sVar2 != 0xffffffffffffffff) {
    (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  }
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == false) {
    pbVar1 = (dirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (input = (dirs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; input != pbVar1; input = input + 1) {
      sVar2 = cmGeneratorExpression::Find(input);
      if (sVar2 != 0xffffffffffffffff) {
        (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
        return;
      }
    }
  }
  return;
}

Assistant:

cmInstallDirectoryGenerator::cmInstallDirectoryGenerator(
  std::vector<std::string> const& dirs, const char* dest,
  const char* file_permissions, const char* dir_permissions,
  std::vector<std::string> const& configurations, const char* component,
  MessageLevel message, bool exclude_from_all, const char* literal_args,
  bool optional)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all)
  , LocalGenerator(nullptr)
  , Directories(dirs)
  , FilePermissions(file_permissions)
  , DirPermissions(dir_permissions)
  , LiteralArguments(literal_args)
  , Optional(optional)
{
  // We need per-config actions if destination have generator expressions.
  if (cmGeneratorExpression::Find(Destination) != std::string::npos) {
    this->ActionsPerConfig = true;
  }

  // We need per-config actions if any directories have generator expressions.
  if (!this->ActionsPerConfig) {
    for (std::string const& dir : dirs) {
      if (cmGeneratorExpression::Find(dir) != std::string::npos) {
        this->ActionsPerConfig = true;
        break;
      }
    }
  }
}